

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O0

bool anon_unknown.dwarf_1a9693::matched(AffixPatternMatcher *affix,UnicodeString *patternString)

{
  UBool UVar1;
  bool bVar2;
  bool local_76;
  bool local_75;
  UnicodeString local_60;
  UnicodeString *local_20;
  UnicodeString *patternString_local;
  AffixPatternMatcher *affix_local;
  
  bVar2 = false;
  local_20 = patternString;
  patternString_local = (UnicodeString *)affix;
  if (affix == (AffixPatternMatcher *)0x0) {
    UVar1 = icu_63::UnicodeString::isBogus(patternString);
    local_75 = true;
    if (UVar1 != '\0') goto LAB_00324b9a;
  }
  bVar2 = patternString_local != (UnicodeString *)0x0;
  local_76 = false;
  if (bVar2) {
    icu_63::numparse::impl::AffixPatternMatcher::getPattern
              (&local_60,(AffixPatternMatcher *)patternString_local);
    UVar1 = icu_63::UnicodeString::operator==(&local_60,local_20);
    local_76 = UVar1 != '\0';
  }
  local_75 = local_76;
LAB_00324b9a:
  affix_local._7_1_ = local_75;
  if (bVar2) {
    icu_63::UnicodeString::~UnicodeString(&local_60);
  }
  return (bool)(affix_local._7_1_ & 1);
}

Assistant:

static bool matched(const AffixPatternMatcher* affix, const UnicodeString& patternString) {
    return (affix == nullptr && patternString.isBogus()) ||
           (affix != nullptr && affix->getPattern() == patternString);
}